

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void write_file_header(j_compress_ptr cinfo)

{
  jpeg_marker_writer *pjVar1;
  my_marker_ptr_conflict marker;
  j_compress_ptr cinfo_local;
  
  pjVar1 = cinfo->marker;
  emit_marker(cinfo,M_SOI);
  *(undefined4 *)&pjVar1[1].write_file_header = 0;
  if (cinfo->write_JFIF_header != 0) {
    emit_jfif_app0(cinfo);
  }
  if (cinfo->write_Adobe_marker != 0) {
    emit_adobe_app14(cinfo);
  }
  return;
}

Assistant:

METHODDEF(void)
write_file_header (j_compress_ptr cinfo)
{
  my_marker_ptr marker = (my_marker_ptr) cinfo->marker;

  emit_marker(cinfo, M_SOI);	/* first the SOI */

  /* SOI is defined to reset restart interval to 0 */
  marker->last_restart_interval = 0;

  if (cinfo->write_JFIF_header)	/* next an optional JFIF APP0 */
    emit_jfif_app0(cinfo);
  if (cinfo->write_Adobe_marker) /* next an optional Adobe APP14 */
    emit_adobe_app14(cinfo);
}